

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DramAnalyzer.cpp
# Opt level: O2

size_t __thiscall DramAnalyzer::count_acts_per_trefi(DramAnalyzer *this)

{
  unsigned_long uVar1;
  value_type pcVar2;
  value_type pcVar3;
  reference pvVar4;
  reference ppcVar5;
  undefined1 *puVar6;
  undefined1 *extraout_RAX;
  ulong extraout_RDX;
  ulong uVar7;
  ulong extraout_RDX_00;
  iterator __begin2;
  ulong uVar8;
  undefined1 auVar9 [8];
  ulong uVar10;
  ulong uVar11;
  pointer pcVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  string local_98;
  undefined1 auStack_78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> acts;
  _Alloc_hider local_58;
  uint64_t value;
  allocator<char> local_31;
  
  pvVar4 = std::
           vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
           ::at(&this->banks,0);
  ppcVar5 = std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>::at(pvVar4,0);
  pcVar2 = *ppcVar5;
  pvVar4 = std::
           vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
           ::at(&this->banks,0);
  ppcVar5 = std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>::at(pvVar4,1);
  pcVar3 = *ppcVar5;
  puVar6 = auStack_78;
  auStack_78 = (undefined1  [8])0x0;
  acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar12 = (pointer)0x0;
  uVar7 = extraout_RDX;
  uVar10 = 0;
  do {
    do {
      do {
        local_58._M_p = (pointer)0x0;
        uVar8 = uVar10;
        do {
          uVar11 = uVar8;
          clflushopt(*pcVar2);
          clflushopt(*pcVar3);
          rdtscp();
          uVar8 = uVar7 << 0x20 | (ulong)puVar6;
          puVar6 = (undefined1 *)CONCAT71((int7)((ulong)puVar6 >> 8),*pcVar3);
          rdtscp();
          uVar7 = (uVar7 << 0x20 | (ulong)puVar6) - uVar8;
          uVar8 = uVar11 + 1;
          local_58._M_p = local_58._M_p + 2;
        } while (uVar7 < 0x3e9);
        puVar6 = (undefined1 *)CONCAT71((int7)(uVar11 >> 8),0x32 < uVar11);
        bVar13 = uVar10 == 0;
        uVar10 = uVar8;
      } while (bVar13 || 0x32 >= uVar11);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_78,
                 (value_type_conflict4 *)&stack0xffffffffffffffa8);
      pcVar12 = pcVar12 + local_58._M_p;
      uVar8 = (long)acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)auStack_78 >> 3;
      puVar6 = (undefined1 *)(uVar8 / 200);
      uVar7 = uVar8 % 200;
    } while (uVar7 != 0);
    auVar15._8_4_ = (int)((ulong)pcVar12 >> 0x20);
    auVar15._0_8_ = pcVar12;
    auVar15._12_4_ = 0x45300000;
    auVar16._8_4_ =
         (int)((long)acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)auStack_78 >> 0x23);
    auVar16._0_8_ = uVar8;
    auVar16._12_4_ = 0x45300000;
    dVar18 = (auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    dVar17 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)pcVar12) - 4503599627370496.0)) / dVar18;
    dVar14 = 0.0;
    for (auVar9 = auStack_78;
        auVar9 != (undefined1  [8])
                  acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; auVar9 = (undefined1  [8])((long)auVar9 + 8)) {
      uVar1 = *(unsigned_long *)auVar9;
      auVar20._8_4_ = (int)(uVar1 >> 0x20);
      auVar20._0_8_ = uVar1;
      auVar20._12_4_ = 0x45300000;
      dVar21 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      dVar19 = dVar21 - dVar17;
      uVar8 = -(ulong)(dVar21 < dVar17);
      dVar14 = (double)(uVar8 & (ulong)dVar14 | ~uVar8 & (ulong)(dVar19 * dVar19 + dVar14));
    }
    dVar14 = dVar14 / dVar18;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
      puVar6 = extraout_RAX;
      uVar7 = extraout_RDX_00;
    }
    else {
      dVar14 = SQRT(dVar14);
    }
  } while (3.0 <= dVar14);
  uVar7 = (ulong)pcVar12 /
          (ulong)((long)acts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffa8,
             "Determined the number of possible ACTs per refresh interval.",
             (allocator<char> *)&local_98);
  Logger::log_info((string *)&stack0xffffffffffffffa8,true);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"num_acts_per_tREFI: %lu",&local_31);
  format_string<unsigned_long>((string *)&stack0xffffffffffffffa8,&local_98,uVar7);
  Logger::log_data((string *)&stack0xffffffffffffffa8,true);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&local_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_78);
  return uVar7;
}

Assistant:

size_t DramAnalyzer::count_acts_per_trefi() {
  size_t skip_first_N = 50;
  // pick two random same-bank addresses
  volatile char *a = banks.at(0).at(0);
  volatile char *b = banks.at(0).at(1);

  std::vector<uint64_t> acts;
  uint64_t running_sum = 0;
  uint64_t before;
  uint64_t after;
  uint64_t count = 0;
  uint64_t count_old = 0;

  // computes the standard deviation
  auto compute_std = [](std::vector<uint64_t> &values, uint64_t running_sum, size_t num_numbers) {
    double mean = static_cast<double>(running_sum)/static_cast<double>(num_numbers);
    double var = 0;
    for (const auto &num : values) {
      if (static_cast<double>(num) < mean) continue;
      var += std::pow(static_cast<double>(num) - mean, 2);
    }
    auto val = std::sqrt(var/static_cast<double>(num_numbers));
    return val;
  };

  for (size_t i = 0;; i++) {
    // flush a and b from caches
    clflushopt(a);
    clflushopt(b);
    mfence();

    // get start timestamp and wait until we retrieved it
    before = rdtscp();
    lfence();

    // do DRAM accesses
    (void)*a;
    (void)*b;

    // get end timestamp
    after = rdtscp();

    count++;
    if ((after - before) > 1000) {
      if (i > skip_first_N && count_old!=0) {
        // multiply by 2 to account for both accesses we do (a, b)
        uint64_t value = (count - count_old)*2;
        acts.push_back(value);
        running_sum += value;
        // check after each 200 data points if our standard deviation reached 1 -> then stop collecting measurements
        if ((acts.size()%200)==0 && compute_std(acts, running_sum, acts.size())<3.0) break;
      }
      count_old = count;
    }
  }

  auto activations = (running_sum/acts.size());
  Logger::log_info("Determined the number of possible ACTs per refresh interval.");
  Logger::log_data(format_string("num_acts_per_tREFI: %lu", activations));

  return activations;
}